

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  int iVar47;
  undefined4 uVar48;
  ulong uVar49;
  long lVar50;
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  ulong *puVar54;
  ulong *puVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong unaff_R15;
  size_t mask;
  bool bVar61;
  bool bVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  vint4 bi;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  vint4 ai;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar81;
  float fVar82;
  undefined1 auVar79 [16];
  float fVar83;
  undefined1 auVar80 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  uint uVar86;
  uint uVar88;
  uint uVar89;
  undefined1 auVar87 [16];
  uint uVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_c30;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  undefined1 local_ba0 [32];
  undefined4 local_b80;
  undefined4 uStack_b7c;
  undefined4 uStack_b78;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 uStack_b68;
  undefined4 uStack_b64;
  undefined4 local_b60;
  undefined4 uStack_b5c;
  undefined4 uStack_b58;
  undefined4 uStack_b54;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined4 uStack_b48;
  undefined4 uStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar75._4_4_ = fVar1;
  auVar75._0_4_ = fVar1;
  auVar75._8_4_ = fVar1;
  auVar75._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar76._4_4_ = fVar2;
  auVar76._0_4_ = fVar2;
  auVar76._8_4_ = fVar2;
  auVar76._12_4_ = fVar2;
  fVar91 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar77._4_4_ = fVar91;
  auVar77._0_4_ = fVar91;
  auVar77._8_4_ = fVar91;
  auVar77._12_4_ = fVar91;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar91 = fVar91 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar56 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar58 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar79._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar79._8_4_ = -fVar1;
  auVar79._12_4_ = -fVar1;
  auVar84._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar84._8_4_ = -fVar2;
  auVar84._12_4_ = -fVar2;
  auVar71._0_8_ = CONCAT44(fVar91,fVar91) ^ 0x8000000080000000;
  auVar71._8_4_ = -fVar91;
  auVar71._12_4_ = -fVar91;
  iVar47 = (tray->tnear).field_0.i[k];
  auVar87._4_4_ = iVar47;
  auVar87._0_4_ = iVar47;
  auVar87._8_4_ = iVar47;
  auVar87._12_4_ = iVar47;
  iVar47 = (tray->tfar).field_0.i[k];
  auVar94._4_4_ = iVar47;
  auVar94._0_4_ = iVar47;
  auVar94._8_4_ = iVar47;
  auVar94._12_4_ = iVar47;
  local_ba0._16_16_ = mm_lookupmask_ps._240_16_;
  local_ba0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar47 = 1 << ((uint)k & 0x1f);
  auVar85._4_4_ = iVar47;
  auVar85._0_4_ = iVar47;
  auVar85._8_4_ = iVar47;
  auVar85._12_4_ = iVar47;
  auVar85._16_4_ = iVar47;
  auVar85._20_4_ = iVar47;
  auVar85._24_4_ = iVar47;
  auVar85._28_4_ = iVar47;
  auVar64 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar85 = vpand_avx2(auVar85,auVar64);
  local_be0 = vpcmpeqd_avx2(auVar85,auVar64);
  local_b60 = 0x7fffffff;
  uStack_b5c = 0x7fffffff;
  uStack_b58 = 0x7fffffff;
  uStack_b54 = 0x7fffffff;
  uStack_b50 = 0x7fffffff;
  uStack_b4c = 0x7fffffff;
  uStack_b48 = 0x7fffffff;
  uStack_b44 = 0x7fffffff;
  local_b80 = 0x80000000;
  uStack_b7c = 0x80000000;
  uStack_b78 = 0x80000000;
  uStack_b74 = 0x80000000;
  uStack_b70 = 0x80000000;
  uStack_b6c = 0x80000000;
  uStack_b68 = 0x80000000;
  uStack_b64 = 0x80000000;
  auVar66._8_4_ = 0x3f800000;
  auVar66._0_8_ = &DAT_3f8000003f800000;
  auVar66._12_4_ = 0x3f800000;
  auVar66._16_4_ = 0x3f800000;
  auVar66._20_4_ = 0x3f800000;
  auVar66._24_4_ = 0x3f800000;
  auVar66._28_4_ = 0x3f800000;
  auVar64._8_4_ = 0xbf800000;
  auVar64._0_8_ = 0xbf800000bf800000;
  auVar64._12_4_ = 0xbf800000;
  auVar64._16_4_ = 0xbf800000;
  auVar64._20_4_ = 0xbf800000;
  auVar64._24_4_ = 0xbf800000;
  auVar64._28_4_ = 0xbf800000;
  _local_bc0 = vblendvps_avx(auVar66,auVar64,local_ba0);
  puVar55 = local_7f8;
  do {
    puVar54 = puVar55;
    if (puVar54 == &local_800) break;
    puVar55 = puVar54 + -1;
    uVar60 = puVar54[-1];
    do {
      if ((uVar60 & 8) == 0) {
        auVar63 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar60 + 0x20 + uVar56),auVar79,auVar75);
        auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar60 + 0x20 + uVar57),auVar84,auVar76);
        auVar63 = vpmaxsd_avx(auVar63,auVar27);
        auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar60 + 0x20 + uVar58),auVar71,auVar77);
        auVar27 = vpmaxsd_avx(auVar27,auVar87);
        auVar63 = vpmaxsd_avx(auVar63,auVar27);
        auVar27 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar60 + 0x20 + (uVar56 ^ 0x10)),auVar79,
                                  auVar75);
        auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar60 + 0x20 + (uVar57 ^ 0x10)),auVar84,
                                  auVar76);
        auVar27 = vpminsd_avx(auVar27,auVar28);
        auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar60 + 0x20 + (uVar58 ^ 0x10)),auVar71,
                                  auVar77);
        auVar28 = vpminsd_avx(auVar28,auVar94);
        auVar27 = vpminsd_avx(auVar27,auVar28);
        auVar63 = vpcmpgtd_avx(auVar63,auVar27);
        uVar48 = vmovmskps_avx(auVar63);
        unaff_R15 = (ulong)(byte)((byte)uVar48 ^ 0xf);
      }
      if ((uVar60 & 8) == 0) {
        if (unaff_R15 == 0) {
          uVar86 = 4;
        }
        else {
          uVar59 = uVar60 & 0xfffffffffffffff0;
          lVar51 = 0;
          for (uVar60 = unaff_R15; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
            lVar51 = lVar51 + 1;
          }
          for (uVar49 = unaff_R15 - 1 & unaff_R15; uVar60 = *(ulong *)(uVar59 + lVar51 * 8),
              uVar49 != 0; uVar49 = uVar49 - 1 & uVar49) {
            *puVar55 = uVar60;
            puVar55 = puVar55 + 1;
            lVar51 = 0;
            for (uVar60 = uVar49; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
              lVar51 = lVar51 + 1;
            }
          }
          uVar86 = 0;
        }
      }
      else {
        uVar86 = 6;
      }
    } while (uVar86 == 0);
    if (uVar86 == 6) {
      uVar59 = (ulong)((uint)uVar60 & 0xf);
      uVar86 = 0;
      uVar49 = uVar59 - 8;
      bVar61 = uVar59 != 8;
      if (bVar61) {
        uVar60 = uVar60 & 0xfffffffffffffff0;
        uVar59 = 0;
        do {
          lVar50 = uVar59 * 0x60;
          pSVar4 = context->scene;
          ppfVar5 = (pSVar4->vertices).items;
          pfVar6 = ppfVar5[*(uint *)(uVar60 + 0x48 + lVar50)];
          auVar68._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar60 + 0x28 + lVar50));
          auVar68._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar60 + 8 + lVar50));
          pfVar7 = ppfVar5[*(uint *)(uVar60 + 0x40 + lVar50)];
          auVar72._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar60 + 0x20 + lVar50));
          auVar72._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar60 + lVar50));
          pfVar8 = ppfVar5[*(uint *)(uVar60 + 0x44 + lVar50)];
          auVar80._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar60 + 0x24 + lVar50));
          auVar80._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar60 + 4 + lVar50));
          pfVar9 = ppfVar5[*(uint *)(uVar60 + 0x4c + lVar50)];
          auVar98._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar60 + 0x2c + lVar50));
          auVar98._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar60 + 0xc + lVar50));
          lVar51 = uVar60 + 0x40 + lVar50;
          local_b20 = *(undefined8 *)(lVar51 + 0x10);
          uStack_b18 = *(undefined8 *)(lVar51 + 0x18);
          uStack_b10 = local_b20;
          uStack_b08 = uStack_b18;
          lVar51 = uVar60 + 0x50 + lVar50;
          local_b40 = *(undefined8 *)(lVar51 + 0x10);
          uStack_b38 = *(undefined8 *)(lVar51 + 0x18);
          auVar28 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar60 + 0x10 + lVar50))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar60 + 0x18 + lVar50)));
          auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar60 + 0x10 + lVar50))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar60 + 0x18 + lVar50)));
          auVar19 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar60 + 0x14 + lVar50))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar60 + 0x1c + lVar50)));
          auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar60 + 0x14 + lVar50))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar60 + 0x1c + lVar50)));
          auVar20 = vunpcklps_avx(auVar63,auVar27);
          auVar21 = vunpcklps_avx(auVar28,auVar19);
          auVar63 = vunpckhps_avx(auVar28,auVar19);
          auVar19 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar60 + 0x30 + lVar50))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar60 + 0x38 + lVar50)));
          auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar60 + 0x30 + lVar50))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar60 + 0x38 + lVar50)));
          auVar22 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar60 + 0x34 + lVar50))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar60 + 0x3c + lVar50)));
          auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar60 + 0x34 + lVar50))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar60 + 0x3c + lVar50)));
          auVar28 = vunpcklps_avx(auVar27,auVar28);
          auVar23 = vunpcklps_avx(auVar19,auVar22);
          auVar27 = vunpckhps_avx(auVar19,auVar22);
          uStack_b30 = local_b40;
          uStack_b28 = uStack_b38;
          auVar85 = vunpcklps_avx(auVar80,auVar98);
          auVar64 = vunpcklps_avx(auVar72,auVar68);
          auVar24 = vunpcklps_avx(auVar64,auVar85);
          auVar18 = vunpckhps_avx(auVar64,auVar85);
          auVar85 = vunpckhps_avx(auVar80,auVar98);
          auVar64 = vunpckhps_avx(auVar72,auVar68);
          auVar25 = vunpcklps_avx(auVar64,auVar85);
          auVar69._16_16_ = auVar21;
          auVar69._0_16_ = auVar21;
          auVar73._16_16_ = auVar63;
          auVar73._0_16_ = auVar63;
          auVar67._16_16_ = auVar20;
          auVar67._0_16_ = auVar20;
          auVar95._16_16_ = auVar23;
          auVar95._0_16_ = auVar23;
          auVar101._16_16_ = auVar27;
          auVar101._0_16_ = auVar27;
          auVar65._16_16_ = auVar28;
          auVar65._0_16_ = auVar28;
          auVar64 = vsubps_avx(auVar24,auVar69);
          auVar85 = vsubps_avx(auVar18,auVar73);
          auVar66 = vsubps_avx(auVar25,auVar67);
          auVar14 = vsubps_avx(auVar95,auVar24);
          auVar15 = vsubps_avx(auVar101,auVar18);
          auVar16 = vsubps_avx(auVar65,auVar25);
          auVar17._4_4_ = auVar16._4_4_ * auVar85._4_4_;
          auVar17._0_4_ = auVar16._0_4_ * auVar85._0_4_;
          auVar17._8_4_ = auVar16._8_4_ * auVar85._8_4_;
          auVar17._12_4_ = auVar16._12_4_ * auVar85._12_4_;
          auVar17._16_4_ = auVar16._16_4_ * auVar85._16_4_;
          auVar17._20_4_ = auVar16._20_4_ * auVar85._20_4_;
          auVar17._24_4_ = auVar16._24_4_ * auVar85._24_4_;
          auVar17._28_4_ = auVar28._12_4_;
          auVar19 = vfmsub231ps_fma(auVar17,auVar15,auVar66);
          auVar29._4_4_ = auVar66._4_4_ * auVar14._4_4_;
          auVar29._0_4_ = auVar66._0_4_ * auVar14._0_4_;
          auVar29._8_4_ = auVar66._8_4_ * auVar14._8_4_;
          auVar29._12_4_ = auVar66._12_4_ * auVar14._12_4_;
          auVar29._16_4_ = auVar66._16_4_ * auVar14._16_4_;
          auVar29._20_4_ = auVar66._20_4_ * auVar14._20_4_;
          auVar29._24_4_ = auVar66._24_4_ * auVar14._24_4_;
          auVar29._28_4_ = auVar20._12_4_;
          auVar20 = vfmsub231ps_fma(auVar29,auVar16,auVar64);
          uVar48 = *(undefined4 *)(ray + k * 4);
          auVar74._4_4_ = uVar48;
          auVar74._0_4_ = uVar48;
          auVar74._8_4_ = uVar48;
          auVar74._12_4_ = uVar48;
          auVar74._16_4_ = uVar48;
          auVar74._20_4_ = uVar48;
          auVar74._24_4_ = uVar48;
          auVar74._28_4_ = uVar48;
          uVar48 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar103._4_4_ = uVar48;
          auVar103._0_4_ = uVar48;
          auVar103._8_4_ = uVar48;
          auVar103._12_4_ = uVar48;
          auVar103._16_4_ = uVar48;
          auVar103._20_4_ = uVar48;
          auVar103._24_4_ = uVar48;
          auVar103._28_4_ = uVar48;
          uVar48 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar105._4_4_ = uVar48;
          auVar105._0_4_ = uVar48;
          auVar105._8_4_ = uVar48;
          auVar105._12_4_ = uVar48;
          auVar105._16_4_ = uVar48;
          auVar105._20_4_ = uVar48;
          auVar105._24_4_ = uVar48;
          auVar105._28_4_ = uVar48;
          fVar1 = *(float *)(ray + k * 4 + 0x80);
          auVar96._4_4_ = fVar1;
          auVar96._0_4_ = fVar1;
          auVar96._8_4_ = fVar1;
          auVar96._12_4_ = fVar1;
          auVar96._16_4_ = fVar1;
          auVar96._20_4_ = fVar1;
          auVar96._24_4_ = fVar1;
          auVar96._28_4_ = fVar1;
          auVar24 = vsubps_avx(auVar24,auVar74);
          fVar2 = *(float *)(ray + k * 4 + 0xa0);
          auVar102._4_4_ = fVar2;
          auVar102._0_4_ = fVar2;
          auVar102._8_4_ = fVar2;
          auVar102._12_4_ = fVar2;
          auVar102._16_4_ = fVar2;
          auVar102._20_4_ = fVar2;
          auVar102._24_4_ = fVar2;
          auVar102._28_4_ = fVar2;
          auVar18 = vsubps_avx(auVar18,auVar103);
          fVar91 = *(float *)(ray + k * 4 + 0xc0);
          auVar104._4_4_ = fVar91;
          auVar104._0_4_ = fVar91;
          auVar104._8_4_ = fVar91;
          auVar104._12_4_ = fVar91;
          auVar104._16_4_ = fVar91;
          auVar104._20_4_ = fVar91;
          auVar104._24_4_ = fVar91;
          auVar104._28_4_ = fVar91;
          auVar17 = vsubps_avx(auVar25,auVar105);
          auVar30._4_4_ = fVar1 * auVar18._4_4_;
          auVar30._0_4_ = fVar1 * auVar18._0_4_;
          auVar30._8_4_ = fVar1 * auVar18._8_4_;
          auVar30._12_4_ = fVar1 * auVar18._12_4_;
          auVar30._16_4_ = fVar1 * auVar18._16_4_;
          auVar30._20_4_ = fVar1 * auVar18._20_4_;
          auVar30._24_4_ = fVar1 * auVar18._24_4_;
          auVar30._28_4_ = auVar25._28_4_;
          auVar63 = vfmsub231ps_fma(auVar30,auVar24,auVar102);
          auVar25._4_4_ = auVar16._4_4_ * auVar63._4_4_;
          auVar25._0_4_ = auVar16._0_4_ * auVar63._0_4_;
          auVar25._8_4_ = auVar16._8_4_ * auVar63._8_4_;
          auVar25._12_4_ = auVar16._12_4_ * auVar63._12_4_;
          auVar25._16_4_ = auVar16._16_4_ * 0.0;
          auVar25._20_4_ = auVar16._20_4_ * 0.0;
          auVar25._24_4_ = auVar16._24_4_ * 0.0;
          auVar25._28_4_ = auVar16._28_4_;
          auVar99._0_4_ = auVar66._0_4_ * auVar63._0_4_;
          auVar99._4_4_ = auVar66._4_4_ * auVar63._4_4_;
          auVar99._8_4_ = auVar66._8_4_ * auVar63._8_4_;
          auVar99._12_4_ = auVar66._12_4_ * auVar63._12_4_;
          auVar99._16_4_ = auVar66._16_4_ * 0.0;
          auVar99._20_4_ = auVar66._20_4_ * 0.0;
          auVar99._24_4_ = auVar66._24_4_ * 0.0;
          auVar99._28_4_ = 0;
          auVar16._4_4_ = fVar91 * auVar24._4_4_;
          auVar16._0_4_ = fVar91 * auVar24._0_4_;
          auVar16._8_4_ = fVar91 * auVar24._8_4_;
          auVar16._12_4_ = fVar91 * auVar24._12_4_;
          auVar16._16_4_ = fVar91 * auVar24._16_4_;
          auVar16._20_4_ = fVar91 * auVar24._20_4_;
          auVar16._24_4_ = fVar91 * auVar24._24_4_;
          auVar16._28_4_ = auVar66._28_4_;
          auVar27 = vfmsub231ps_fma(auVar16,auVar17,auVar96);
          auVar63 = vfmadd231ps_fma(auVar25,ZEXT1632(auVar27),auVar15);
          auVar27 = vfmadd231ps_fma(auVar99,auVar85,ZEXT1632(auVar27));
          auVar31._4_4_ = auVar64._4_4_ * auVar15._4_4_;
          auVar31._0_4_ = auVar64._0_4_ * auVar15._0_4_;
          auVar31._8_4_ = auVar64._8_4_ * auVar15._8_4_;
          auVar31._12_4_ = auVar64._12_4_ * auVar15._12_4_;
          auVar31._16_4_ = auVar64._16_4_ * auVar15._16_4_;
          auVar31._20_4_ = auVar64._20_4_ * auVar15._20_4_;
          auVar31._24_4_ = auVar64._24_4_ * auVar15._24_4_;
          auVar31._28_4_ = auVar15._28_4_;
          auVar21 = vfmsub231ps_fma(auVar31,auVar14,auVar85);
          auVar15._4_4_ = fVar2 * auVar17._4_4_;
          auVar15._0_4_ = fVar2 * auVar17._0_4_;
          auVar15._8_4_ = fVar2 * auVar17._8_4_;
          auVar15._12_4_ = fVar2 * auVar17._12_4_;
          auVar15._16_4_ = fVar2 * auVar17._16_4_;
          auVar15._20_4_ = fVar2 * auVar17._20_4_;
          auVar15._24_4_ = fVar2 * auVar17._24_4_;
          auVar15._28_4_ = auVar85._28_4_;
          auVar22 = vfmsub231ps_fma(auVar15,auVar18,auVar104);
          fVar1 = auVar21._0_4_;
          fVar2 = auVar21._4_4_;
          auVar32._4_4_ = fVar91 * fVar2;
          auVar32._0_4_ = fVar91 * fVar1;
          fVar12 = auVar21._8_4_;
          auVar32._8_4_ = fVar91 * fVar12;
          fVar13 = auVar21._12_4_;
          auVar32._12_4_ = fVar91 * fVar13;
          auVar32._16_4_ = fVar91 * 0.0;
          auVar32._20_4_ = fVar91 * 0.0;
          auVar32._24_4_ = fVar91 * 0.0;
          auVar32._28_4_ = fVar91;
          auVar28 = vfmadd231ps_fma(auVar32,ZEXT1632(auVar20),auVar102);
          auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),ZEXT1632(auVar19),auVar96);
          auVar63 = vfmadd231ps_fma(ZEXT1632(auVar63),ZEXT1632(auVar22),auVar14);
          auVar14._4_4_ = uStack_b7c;
          auVar14._0_4_ = local_b80;
          auVar14._8_4_ = uStack_b78;
          auVar14._12_4_ = uStack_b74;
          auVar14._16_4_ = uStack_b70;
          auVar14._20_4_ = uStack_b6c;
          auVar14._24_4_ = uStack_b68;
          auVar14._28_4_ = uStack_b64;
          auVar85 = vandps_avx(ZEXT1632(auVar28),auVar14);
          uVar86 = auVar85._0_4_;
          local_b00._0_4_ = (float)(uVar86 ^ auVar63._0_4_);
          uVar88 = auVar85._4_4_;
          local_b00._4_4_ = (float)(uVar88 ^ auVar63._4_4_);
          uVar89 = auVar85._8_4_;
          local_b00._8_4_ = (float)(uVar89 ^ auVar63._8_4_);
          uVar90 = auVar85._12_4_;
          local_b00._12_4_ = (float)(uVar90 ^ auVar63._12_4_);
          fVar91 = auVar85._16_4_;
          local_b00._16_4_ = fVar91;
          fVar92 = auVar85._20_4_;
          local_b00._20_4_ = fVar92;
          fVar93 = auVar85._24_4_;
          local_b00._24_4_ = fVar93;
          fStack_9a4 = auVar85._28_4_;
          local_b00._28_4_ = fStack_9a4;
          auVar63 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar64,ZEXT1632(auVar22));
          local_ae0._0_4_ = (float)(uVar86 ^ auVar63._0_4_);
          local_ae0._4_4_ = (float)(uVar88 ^ auVar63._4_4_);
          local_ae0._8_4_ = (float)(uVar89 ^ auVar63._8_4_);
          local_ae0._12_4_ = (float)(uVar90 ^ auVar63._12_4_);
          local_ae0._16_4_ = fVar91;
          local_ae0._20_4_ = fVar92;
          local_ae0._24_4_ = fVar93;
          local_ae0._28_4_ = fStack_9a4;
          auVar85 = vcmpps_avx(local_b00,ZEXT832(0) << 0x20,5);
          auVar64 = vcmpps_avx(local_ae0,ZEXT832(0) << 0x20,5);
          auVar85 = vandps_avx(auVar64,auVar85);
          auVar46._4_4_ = uStack_b5c;
          auVar46._0_4_ = local_b60;
          auVar46._8_4_ = uStack_b58;
          auVar46._12_4_ = uStack_b54;
          auVar46._16_4_ = uStack_b50;
          auVar46._20_4_ = uStack_b4c;
          auVar46._24_4_ = uStack_b48;
          auVar46._28_4_ = uStack_b44;
          local_aa0 = vandps_avx(ZEXT1632(auVar28),auVar46);
          auVar64 = vcmpps_avx(ZEXT1632(auVar28),ZEXT832(0) << 0x20,4);
          auVar85 = vandps_avx(auVar85,auVar64);
          auVar100._0_4_ = local_b00._0_4_ + local_ae0._0_4_;
          auVar100._4_4_ = local_b00._4_4_ + local_ae0._4_4_;
          auVar100._8_4_ = local_b00._8_4_ + local_ae0._8_4_;
          auVar100._12_4_ = local_b00._12_4_ + local_ae0._12_4_;
          auVar100._16_4_ = fVar91 + fVar91;
          auVar100._20_4_ = fVar92 + fVar92;
          auVar100._24_4_ = fVar93 + fVar93;
          auVar100._28_4_ = fStack_9a4 + fStack_9a4;
          auVar64 = vcmpps_avx(auVar100,local_aa0,2);
          auVar66 = auVar64 & auVar85;
          if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar66 >> 0x7f,0) != '\0') ||
                (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar66 >> 0xbf,0) != '\0') ||
              (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar66[0x1f] < '\0') {
            auVar85 = vandps_avx(auVar85,auVar64);
            auVar63 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
            auVar33._4_4_ = auVar17._4_4_ * fVar2;
            auVar33._0_4_ = auVar17._0_4_ * fVar1;
            auVar33._8_4_ = auVar17._8_4_ * fVar12;
            auVar33._12_4_ = auVar17._12_4_ * fVar13;
            auVar33._16_4_ = auVar17._16_4_ * 0.0;
            auVar33._20_4_ = auVar17._20_4_ * 0.0;
            auVar33._24_4_ = auVar17._24_4_ * 0.0;
            auVar33._28_4_ = auVar17._28_4_;
            auVar27 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar20),auVar33);
            auVar27 = vfmadd213ps_fma(auVar24,ZEXT1632(auVar19),ZEXT1632(auVar27));
            local_ac0._0_4_ = (float)(uVar86 ^ auVar27._0_4_);
            local_ac0._4_4_ = (float)(uVar88 ^ auVar27._4_4_);
            local_ac0._8_4_ = (float)(uVar89 ^ auVar27._8_4_);
            local_ac0._12_4_ = (float)(uVar90 ^ auVar27._12_4_);
            local_ac0._16_4_ = fVar91;
            local_ac0._20_4_ = fVar92;
            local_ac0._24_4_ = fVar93;
            local_ac0._28_4_ = fStack_9a4;
            fVar78 = *(float *)(ray + k * 4 + 0x60);
            auVar24._4_4_ = local_aa0._4_4_ * fVar78;
            auVar24._0_4_ = local_aa0._0_4_ * fVar78;
            auVar24._8_4_ = local_aa0._8_4_ * fVar78;
            auVar24._12_4_ = local_aa0._12_4_ * fVar78;
            auVar24._16_4_ = local_aa0._16_4_ * fVar78;
            auVar24._20_4_ = local_aa0._20_4_ * fVar78;
            auVar24._24_4_ = local_aa0._24_4_ * fVar78;
            auVar24._28_4_ = fVar78;
            auVar85 = vcmpps_avx(auVar24,local_ac0,1);
            fVar78 = *(float *)(ray + k * 4 + 0x100);
            auVar18._4_4_ = fVar78 * local_aa0._4_4_;
            auVar18._0_4_ = fVar78 * local_aa0._0_4_;
            auVar18._8_4_ = fVar78 * local_aa0._8_4_;
            auVar18._12_4_ = fVar78 * local_aa0._12_4_;
            auVar18._16_4_ = fVar78 * local_aa0._16_4_;
            auVar18._20_4_ = fVar78 * local_aa0._20_4_;
            auVar18._24_4_ = fVar78 * local_aa0._24_4_;
            auVar18._28_4_ = fVar78;
            auVar64 = vcmpps_avx(local_ac0,auVar18,2);
            auVar85 = vandps_avx(auVar64,auVar85);
            auVar27 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
            auVar63 = vpand_avx(auVar63,auVar27);
            auVar85 = vpmovzxwd_avx2(auVar63);
            auVar85 = vpslld_avx2(auVar85,0x1f);
            if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar85 >> 0x7f,0) != '\0') ||
                  (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar85 >> 0xbf,0) != '\0') ||
                (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar85[0x1f] < '\0') {
              local_a20 = vpsrad_avx2(auVar85,0x1f);
              local_a80 = ZEXT1632(auVar19);
              local_a60 = ZEXT1632(auVar20);
              local_a40 = ZEXT1632(auVar21);
              auVar85 = vrcpps_avx(local_aa0);
              local_940 = local_ba0;
              auVar97._8_4_ = 0x3f800000;
              auVar97._0_8_ = &DAT_3f8000003f800000;
              auVar97._12_4_ = 0x3f800000;
              auVar97._16_4_ = 0x3f800000;
              auVar97._20_4_ = 0x3f800000;
              auVar97._24_4_ = 0x3f800000;
              auVar97._28_4_ = 0x3f800000;
              auVar27 = vfnmadd213ps_fma(local_aa0,auVar85,auVar97);
              auVar27 = vfmadd132ps_fma(ZEXT1632(auVar27),auVar85,auVar85);
              fVar78 = auVar27._0_4_;
              fVar81 = auVar27._4_4_;
              fVar82 = auVar27._8_4_;
              fVar83 = auVar27._12_4_;
              local_9c0[0] = fVar78 * local_ac0._0_4_;
              local_9c0[1] = fVar81 * local_ac0._4_4_;
              local_9c0[2] = fVar82 * local_ac0._8_4_;
              local_9c0[3] = fVar83 * local_ac0._12_4_;
              fStack_9b0 = fVar91 * 0.0;
              fStack_9ac = fVar92 * 0.0;
              fStack_9a8 = fVar93 * 0.0;
              auVar34._4_4_ = fVar81 * local_b00._4_4_;
              auVar34._0_4_ = fVar78 * local_b00._0_4_;
              auVar34._8_4_ = fVar82 * local_b00._8_4_;
              auVar34._12_4_ = fVar83 * local_b00._12_4_;
              auVar34._16_4_ = fVar91 * 0.0;
              auVar34._20_4_ = fVar92 * 0.0;
              auVar34._24_4_ = fVar93 * 0.0;
              auVar34._28_4_ = fStack_9a4;
              auVar85 = vminps_avx(auVar34,auVar97);
              auVar35._4_4_ = fVar81 * local_ae0._4_4_;
              auVar35._0_4_ = fVar78 * local_ae0._0_4_;
              auVar35._8_4_ = fVar82 * local_ae0._8_4_;
              auVar35._12_4_ = fVar83 * local_ae0._12_4_;
              auVar35._16_4_ = fVar91 * 0.0;
              auVar35._20_4_ = fVar92 * 0.0;
              auVar35._24_4_ = fVar93 * 0.0;
              auVar35._28_4_ = fStack_9a4;
              auVar64 = vminps_avx(auVar35,auVar97);
              auVar66 = vsubps_avx(auVar97,auVar85);
              auVar14 = vsubps_avx(auVar97,auVar64);
              local_9e0 = vblendvps_avx(auVar64,auVar66,local_ba0);
              local_a00 = vblendvps_avx(auVar85,auVar14,local_ba0);
              local_9a0._0_4_ = auVar19._0_4_ * (float)local_bc0._0_4_;
              local_9a0._4_4_ = auVar19._4_4_ * (float)local_bc0._4_4_;
              local_9a0._8_4_ = auVar19._8_4_ * fStack_bb8;
              local_9a0._12_4_ = auVar19._12_4_ * fStack_bb4;
              local_9a0._16_4_ = fStack_bb0 * 0.0;
              local_9a0._20_4_ = fStack_bac * 0.0;
              local_9a0._24_4_ = fStack_ba8 * 0.0;
              local_9a0._28_4_ = 0;
              local_980._0_4_ = (float)local_bc0._0_4_ * auVar20._0_4_;
              local_980._4_4_ = (float)local_bc0._4_4_ * auVar20._4_4_;
              local_980._8_4_ = fStack_bb8 * auVar20._8_4_;
              local_980._12_4_ = fStack_bb4 * auVar20._12_4_;
              local_980._16_4_ = fStack_bb0 * 0.0;
              local_980._20_4_ = fStack_bac * 0.0;
              local_980._24_4_ = fStack_ba8 * 0.0;
              local_980._28_4_ = 0;
              local_960._0_4_ = (float)local_bc0._0_4_ * fVar1;
              local_960._4_4_ = (float)local_bc0._4_4_ * fVar2;
              local_960._8_4_ = fStack_bb8 * fVar12;
              local_960._12_4_ = fStack_bb4 * fVar13;
              local_960._16_4_ = fStack_bb0 * 0.0;
              local_960._20_4_ = fStack_bac * 0.0;
              local_960._24_4_ = fStack_ba8 * 0.0;
              local_960._28_4_ = 0;
              auVar63 = vpsllw_avx(auVar63,0xf);
              auVar63 = vpacksswb_avx(auVar63,auVar63);
              uVar53 = (ulong)(byte)(SUB161(auVar63 >> 7,0) & 1 |
                                     (SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar63 >> 0x3f,0) << 7);
              do {
                uVar26 = 0;
                for (uVar52 = uVar53; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000)
                {
                  uVar26 = uVar26 + 1;
                }
                uVar86 = *(uint *)((long)&local_b20 + uVar26 * 4);
                pGVar10 = (pSVar4->geometries).items[uVar86].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  uVar53 = uVar53 ^ 1L << (uVar26 & 0x3f);
                  bVar62 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar62 = false;
                }
                else {
                  uVar48 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uVar52 = (ulong)(uint)((int)uVar26 * 4);
                  uVar3 = *(undefined4 *)(local_a00 + uVar52);
                  local_8c0._4_4_ = uVar3;
                  local_8c0._0_4_ = uVar3;
                  local_8c0._8_4_ = uVar3;
                  local_8c0._12_4_ = uVar3;
                  local_8c0._16_4_ = uVar3;
                  local_8c0._20_4_ = uVar3;
                  local_8c0._24_4_ = uVar3;
                  local_8c0._28_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_9e0 + uVar52);
                  local_8a0._4_4_ = uVar3;
                  local_8a0._0_4_ = uVar3;
                  local_8a0._8_4_ = uVar3;
                  local_8a0._12_4_ = uVar3;
                  local_8a0._16_4_ = uVar3;
                  local_8a0._20_4_ = uVar3;
                  local_8a0._24_4_ = uVar3;
                  local_8a0._28_4_ = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_9c0 + uVar52);
                  local_c30.context = context->user;
                  local_880 = *(undefined4 *)((long)&local_b40 + uVar52);
                  local_920 = *(undefined4 *)(local_9a0 + uVar52);
                  local_900 = *(undefined4 *)(local_980 + uVar52);
                  local_8e0 = *(undefined4 *)(local_960 + uVar52);
                  local_860._4_4_ = uVar86;
                  local_860._0_4_ = uVar86;
                  local_860._8_4_ = uVar86;
                  local_860._12_4_ = uVar86;
                  local_860._16_4_ = uVar86;
                  local_860._20_4_ = uVar86;
                  local_860._24_4_ = uVar86;
                  local_860._28_4_ = uVar86;
                  uStack_91c = local_920;
                  uStack_918 = local_920;
                  uStack_914 = local_920;
                  uStack_910 = local_920;
                  uStack_90c = local_920;
                  uStack_908 = local_920;
                  uStack_904 = local_920;
                  uStack_8fc = local_900;
                  uStack_8f8 = local_900;
                  uStack_8f4 = local_900;
                  uStack_8f0 = local_900;
                  uStack_8ec = local_900;
                  uStack_8e8 = local_900;
                  uStack_8e4 = local_900;
                  uStack_8dc = local_8e0;
                  uStack_8d8 = local_8e0;
                  uStack_8d4 = local_8e0;
                  uStack_8d0 = local_8e0;
                  uStack_8cc = local_8e0;
                  uStack_8c8 = local_8e0;
                  uStack_8c4 = local_8e0;
                  uStack_87c = local_880;
                  uStack_878 = local_880;
                  uStack_874 = local_880;
                  uStack_870 = local_880;
                  uStack_86c = local_880;
                  uStack_868 = local_880;
                  uStack_864 = local_880;
                  vpcmpeqd_avx2(local_8c0,local_8c0);
                  uStack_83c = (local_c30.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_c30.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_c00 = local_be0._0_8_;
                  uStack_bf8 = local_be0._8_8_;
                  uStack_bf0 = local_be0._16_8_;
                  uStack_be8 = local_be0._24_8_;
                  local_c30.valid = (int *)&local_c00;
                  local_c30.geometryUserPtr = pGVar10->userPtr;
                  local_c30.hit = (RTCHitN *)&local_920;
                  local_c30.N = 8;
                  local_c30.ray = (RTCRayN *)ray;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&local_c30);
                  }
                  auVar44._8_8_ = uStack_bf8;
                  auVar44._0_8_ = local_c00;
                  auVar44._16_8_ = uStack_bf0;
                  auVar44._24_8_ = uStack_be8;
                  auVar64 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar44);
                  auVar85 = _DAT_0205a980 & ~auVar64;
                  if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar85 >> 0x7f,0) == '\0') &&
                        (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar85 >> 0xbf,0) == '\0') &&
                      (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar85[0x1f]) {
                    auVar64 = auVar64 ^ _DAT_0205a980;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_c30);
                    }
                    auVar45._8_8_ = uStack_bf8;
                    auVar45._0_8_ = local_c00;
                    auVar45._16_8_ = uStack_bf0;
                    auVar45._24_8_ = uStack_be8;
                    auVar85 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar45);
                    auVar64 = auVar85 ^ _DAT_0205a980;
                    auVar70._8_4_ = 0xff800000;
                    auVar70._0_8_ = 0xff800000ff800000;
                    auVar70._12_4_ = 0xff800000;
                    auVar70._16_4_ = 0xff800000;
                    auVar70._20_4_ = 0xff800000;
                    auVar70._24_4_ = 0xff800000;
                    auVar70._28_4_ = 0xff800000;
                    auVar85 = vblendvps_avx(auVar70,*(undefined1 (*) [32])(local_c30.ray + 0x100),
                                            auVar85);
                    *(undefined1 (*) [32])(local_c30.ray + 0x100) = auVar85;
                  }
                  bVar42 = (auVar64 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar43 = (auVar64 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar41 = (auVar64 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
                  bVar40 = SUB321(auVar64 >> 0x7f,0) == '\0';
                  bVar39 = (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar38 = SUB321(auVar64 >> 0xbf,0) == '\0';
                  bVar37 = (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
                  bVar36 = -1 < auVar64[0x1f];
                  bVar62 = ((((((bVar42 && bVar43) && bVar41) && bVar40) && bVar39) && bVar38) &&
                           bVar37) && bVar36;
                  if (((((((bVar42 && bVar43) && bVar41) && bVar40) && bVar39) && bVar38) && bVar37)
                      && bVar36) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar48;
                    uVar53 = uVar53 ^ 1L << (uVar26 & 0x3f);
                  }
                }
                if (!bVar62) {
                  uVar86 = 0;
                  if (bVar61) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    uVar86 = 1;
                  }
                  goto LAB_005f2e32;
                }
              } while (uVar53 != 0);
            }
          }
          uVar59 = uVar59 + 1;
          bVar61 = uVar59 < uVar49;
        } while (uVar59 != uVar49);
        uVar86 = 0;
      }
    }
LAB_005f2e32:
  } while ((uVar86 & 3) == 0);
  return puVar54 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }